

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxStructMember::Resolve(FxStructMember *this,FCompileContext *ctx)

{
  EFxType EVar1;
  PType *pPVar2;
  _func_int **pp_Var3;
  PField *pPVar4;
  _func_int **pp_Var5;
  PStruct *pPVar6;
  PClass *pPVar7;
  PInt *pPVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  PClass *pPVar11;
  PClass *pPVar12;
  long *plVar13;
  code *UNRECOVERED_JUMPTABLE;
  FxExpression *pFVar14;
  undefined4 extraout_var_01;
  PPointer *pPVar15;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PField *pPVar16;
  undefined4 extraout_var_04;
  FxExpression *pFVar17;
  undefined8 *puVar18;
  char *pcVar19;
  PInt **ppPVar20;
  bool bVar21;
  FName local_3c;
  FName local_38;
  FName local_34;
  undefined4 extraout_var_00;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->classx != (FxExpression *)0x0) {
    iVar9 = (*this->classx->_vptr_FxExpression[2])();
    pFVar14 = (FxExpression *)CONCAT44(extraout_var,iVar9);
    this->classx = pFVar14;
    pPVar12 = PPointer::RegistrationInfo.MyClass;
    if (pFVar14 != (FxExpression *)0x0) {
      pPVar2 = pFVar14->ValueType;
      pPVar11 = (pPVar2->super_PTypeBase).super_DObject.Class;
      if (*(int *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.field_0x24 ==
          0x249) {
        if (pPVar11 == (PClass *)0x0) {
          iVar9 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
          pPVar11 = (PClass *)CONCAT44(extraout_var_00,iVar9);
          (pPVar2->super_PTypeBase).super_DObject.Class = pPVar11;
        }
        pPVar7 = AActor::RegistrationInfo.MyClass;
        bVar21 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar12 && bVar21) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar21 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar12) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (bVar21) {
          pp_Var3 = this->classx->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject;
          pPVar12 = (PClass *)pp_Var3[1];
          if (pPVar12 == (PClass *)0x0) {
            pPVar12 = (PClass *)(**(code **)*pp_Var3)(pp_Var3);
            pp_Var3[1] = (_func_int *)pPVar12;
          }
          bVar21 = pPVar12 != (PClass *)0x0;
          if (pPVar12 != pPVar7 && bVar21) {
            do {
              pPVar12 = pPVar12->ParentClass;
              bVar21 = pPVar12 != (PClass *)0x0;
              if (pPVar12 == pPVar7) break;
            } while (pPVar12 != (PClass *)0x0);
          }
          if (bVar21) {
            plVar13 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
            pFVar14 = this->classx;
            *plVar13 = (long)&PTR__FxExpression_0070d370;
            FScriptPosition::FScriptPosition
                      ((FScriptPosition *)(plVar13 + 1),&(this->super_FxExpression).ScriptPosition);
            plVar13[3] = 0;
            *(undefined2 *)(plVar13 + 4) = 0x100;
            *(undefined4 *)((long)plVar13 + 0x24) = 3;
            *plVar13 = (long)&PTR__FxClassDefaults_0070c790;
            plVar13[5] = (long)pFVar14;
            *(undefined1 *)(plVar13 + 6) = 0;
            this->classx = (FxExpression *)0x0;
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            UNRECOVERED_JUMPTABLE = *(code **)(*plVar13 + 0x10);
LAB_00530a9e:
            pFVar14 = (FxExpression *)(*UNRECOVERED_JUMPTABLE)(plVar13,ctx);
            return pFVar14;
          }
        }
        pcVar19 = "\'Default\' requires an actor type.";
      }
      else {
        if (pPVar11 == (PClass *)0x0) {
          iVar9 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
          pPVar11 = (PClass *)CONCAT44(extraout_var_01,iVar9);
          (pPVar2->super_PTypeBase).super_DObject.Class = pPVar11;
        }
        pPVar7 = PStruct::RegistrationInfo.MyClass;
        bVar21 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar12 && bVar21) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar21 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar12) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        pPVar2 = this->classx->ValueType;
        if (!bVar21) {
          pPVar12 = (pPVar2->super_PTypeBase).super_DObject.Class;
          if (pPVar12 == (PClass *)0x0) {
            iVar9 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
            pPVar12 = (PClass *)CONCAT44(extraout_var_03,iVar9);
            (pPVar2->super_PTypeBase).super_DObject.Class = pPVar12;
          }
          bVar21 = pPVar12 != (PClass *)0x0;
          if (pPVar12 != pPVar7 && bVar21) {
            do {
              pPVar12 = pPVar12->ParentClass;
              bVar21 = pPVar12 != (PClass *)0x0;
              if (pPVar12 == pPVar7) break;
            } while (pPVar12 != (PClass *)0x0);
          }
          if (bVar21) {
            pFVar14 = this->classx;
            EVar1 = pFVar14->ExprType;
            if ((int)EVar1 < 0x42) {
              if (EVar1 - EFX_ClassMember < 2) {
                pcVar19 = pFVar14[1].ScriptPosition.FileName.Chars;
                pPVar16 = (PField *)
                          M_Malloc_Dbg(0x40,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                                       ,0x1f9);
                pPVar4 = this->membervar;
                local_34.Index =
                     *(int *)&(pPVar4->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
                PField::PField(pPVar16,&local_34,pPVar4->Type,
                               *(uint *)(pcVar19 + 0x38) | pPVar4->Flags,
                               *(long *)(pcVar19 + 0x28) + pPVar4->Offset,0);
                pPVar16->BitValue = this->membervar->BitValue;
                pFVar14 = this->classx;
                pFVar14[1].ScriptPosition.FileName.Chars = (char *)pPVar16;
                goto LAB_00530dc1;
              }
              if (EVar1 == EFX_LocalVariable) {
                pPVar6 = (PStruct *)pFVar14->ValueType;
                if ((pPVar6 == TypeVector2) || (pPVar6 == TypeVector3)) {
                  pPVar4 = this->membervar;
                  *(int *)((long)&pFVar14[1].ScriptPosition.FileName.Chars + 4) =
                       (int)(pPVar4->Offset >> 3);
                  pFVar14->ValueType = pPVar4->Type;
                  this->classx = (FxExpression *)0x0;
                  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
                  return pFVar14;
                }
                if (pPVar6 == TypeColorStruct) {
                  uVar10 = *(int *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.
                                    field_0x24 - 0x28f;
                  if (uVar10 < 3) {
                    pFVar14->ValueType = (PType *)TypeColor;
                    pFVar17 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
                    puVar18 = (undefined8 *)FMemArena::Alloc(&FxAlloc,0x38);
                    *puVar18 = &PTR__FxExpression_0070d370;
                    FScriptPosition::FScriptPosition
                              ((FScriptPosition *)(puVar18 + 1),
                               &(this->super_FxExpression).ScriptPosition);
                    *(undefined1 *)((long)puVar18 + 0x21) = 1;
                    *(undefined4 *)((long)puVar18 + 0x24) = 4;
                    *puVar18 = &PTR__FxConstant_0070d3e8;
                    pPVar8 = TypeSInt32;
                    ppPVar20 = &TypeSInt32;
                    puVar18[5] = TypeSInt32;
                    puVar18[3] = pPVar8;
                    *(uint *)(puVar18 + 6) = uVar10 * -8 + 0x18;
                    *(undefined1 *)(puVar18 + 4) = 1;
                    pFVar17->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
                    FScriptPosition::FScriptPosition
                              (&pFVar17->ScriptPosition,&pFVar14->ScriptPosition);
                    pFVar17->isresolved = false;
                    pFVar17->NeedResult = true;
                    *(undefined8 *)&pFVar17->ExprType = 0x11700000016;
                    pFVar17[1].ScriptPosition.FileName.Chars = (char *)pFVar14;
                    *(undefined8 **)&pFVar17[1].ScriptPosition.ScriptLine = puVar18;
                    pFVar17->_vptr_FxExpression = (_func_int **)&PTR__FxBinary_0070bf70;
                    pFVar14 = pFVar17;
                  }
                  else {
                    ppPVar20 = (PInt **)&TypeColor;
                  }
                  pFVar14->ValueType = (PType *)*ppPVar20;
                  plVar13 = (long *)FMemArena::Alloc(&FxAlloc,0x40);
                  puVar18 = (undefined8 *)FMemArena::Alloc(&FxAlloc,0x38);
                  *puVar18 = &PTR__FxExpression_0070d370;
                  FScriptPosition::FScriptPosition
                            ((FScriptPosition *)(puVar18 + 1),
                             &(this->super_FxExpression).ScriptPosition);
                  *(undefined1 *)((long)puVar18 + 0x21) = 1;
                  *(undefined4 *)((long)puVar18 + 0x24) = 4;
                  *puVar18 = &PTR__FxConstant_0070d3e8;
                  pPVar8 = TypeSInt32;
                  puVar18[5] = TypeSInt32;
                  puVar18[3] = pPVar8;
                  *(undefined4 *)(puVar18 + 6) = 0xff;
                  *(undefined1 *)(puVar18 + 4) = 1;
                  *plVar13 = (long)&PTR__FxExpression_0070d370;
                  FScriptPosition::FScriptPosition
                            ((FScriptPosition *)(plVar13 + 1),&pFVar14->ScriptPosition);
                  *(undefined2 *)(plVar13 + 4) = 0x100;
                  *(undefined8 *)((long)plVar13 + 0x24) = 0x2600000016;
                  plVar13[6] = (long)pFVar14;
                  plVar13[7] = (long)puVar18;
                  *plVar13 = (long)&PTR__FxBinary_0070bf08;
                  plVar13[3] = (long)TypeSInt32;
                  this->classx = (FxExpression *)0x0;
                  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
                  UNRECOVERED_JUMPTABLE = *(code **)(*plVar13 + 0x10);
                  goto LAB_00530a9e;
                }
              }
            }
            else {
              if (EVar1 == EFX_GlobalVariable) {
                pp_Var3 = pFVar14[1]._vptr_FxExpression;
                pPVar16 = (PField *)
                          M_Malloc_Dbg(0x40,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                                       ,0x1f9);
                pPVar4 = this->membervar;
                local_38.Index =
                     *(int *)&(pPVar4->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
                PField::PField(pPVar16,&local_38,pPVar4->Type,*(uint *)(pp_Var3 + 7) | pPVar4->Flags
                               ,(size_t)(pp_Var3[5] + pPVar4->Offset),0);
                pPVar16->BitValue = this->membervar->BitValue;
                pFVar14 = this->classx;
                pFVar14[1]._vptr_FxExpression = (_func_int **)pPVar16;
LAB_00530dc1:
                pFVar14->isresolved = false;
                iVar9 = (*pFVar14->_vptr_FxExpression[2])(pFVar14,ctx);
                this->classx = (FxExpression *)0x0;
                return (FxExpression *)CONCAT44(extraout_var_04,iVar9);
              }
              if (EVar1 == EFX_StackVariable) {
                pp_Var3 = pFVar14[1]._vptr_FxExpression;
                pPVar16 = (PField *)
                          M_Malloc_Dbg(0x40,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                                       ,0x1f9);
                pPVar4 = this->membervar;
                local_3c.Index =
                     *(int *)&(pPVar4->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
                PField::PField(pPVar16,&local_3c,pPVar4->Type,*(uint *)(pp_Var3 + 7) | pPVar4->Flags
                               ,(size_t)(pp_Var3[5] + pPVar4->Offset),0);
                pPVar16->BitValue = this->membervar->BitValue;
                pFVar14 = this->classx;
                pp_Var5 = pFVar14[1]._vptr_FxExpression;
                pp_Var3 = pp_Var5 + 4;
                *(uint *)pp_Var3 = *(uint *)pp_Var3 | 0x80;
                (**(code **)(*pp_Var5 + 0x10))();
                pFVar14[1]._vptr_FxExpression = (_func_int **)pPVar16;
                pFVar14 = this->classx;
                goto LAB_00530dc1;
              }
            }
            iVar9 = (*pFVar14->_vptr_FxExpression[4])(pFVar14,ctx,&this->AddressWritable);
            if ((char)iVar9 == '\0') {
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,2,
                         "unable to dereference left side of %s",
                         FName::NameData.NameArray
                         [*(int *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.
                                   field_0x24].Text);
              goto LAB_00530b89;
            }
          }
LAB_00530d52:
          (this->super_FxExpression).ValueType = this->membervar->Type;
          return &this->super_FxExpression;
        }
        pPVar15 = dyn_cast<PPointer>((DObject *)pPVar2);
        pPVar12 = PStruct::RegistrationInfo.MyClass;
        if (pPVar15 != (PPointer *)0x0) {
          pPVar2 = pPVar15->PointedType;
          pPVar11 = (pPVar2->super_PTypeBase).super_DObject.Class;
          if (pPVar11 == (PClass *)0x0) {
            iVar9 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
            pPVar11 = (PClass *)CONCAT44(extraout_var_02,iVar9);
            (pPVar2->super_PTypeBase).super_DObject.Class = pPVar11;
          }
          bVar21 = pPVar11 != (PClass *)0x0;
          if (pPVar11 != pPVar12 && bVar21) {
            do {
              pPVar11 = pPVar11->ParentClass;
              bVar21 = pPVar11 != (PClass *)0x0;
              if (pPVar11 == pPVar12) break;
            } while (pPVar11 != (PClass *)0x0);
          }
          if (bVar21) goto LAB_00530d52;
        }
        pcVar19 = "Member variable requires a struct or class object.";
      }
      FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar19);
    }
  }
LAB_00530b89:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxStructMember::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(classx, ctx);

	if (membervar->SymbolName == NAME_Default)
	{
		if (!classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer))
			|| !static_cast<PPointer *>(classx->ValueType)->PointedType->IsKindOf(RUNTIME_CLASS(AActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}
		FxExpression * x = new FxClassDefaults(classx, ScriptPosition);
		classx = nullptr;
		delete this;
		return x->Resolve(ctx);
	}

	if (classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		PPointer *ptrtype = dyn_cast<PPointer>(classx->ValueType);
		if (ptrtype == nullptr || !ptrtype->PointedType->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			ScriptPosition.Message(MSG_ERROR, "Member variable requires a struct or class object.");
			delete this;
			return nullptr;
		}
	}
	else if (classx->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		// if this is a struct within a class or another struct we can simplify the expression by creating a new PField with a cumulative offset.
		if (classx->ExprType == EFX_ClassMember || classx->ExprType == EFX_StructMember)
		{
			auto parentfield = static_cast<FxStructMember *>(classx)->membervar;
			// PFields are garbage collected so this will be automatically taken care of later.
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxStructMember *>(classx)->membervar = newfield;
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_GlobalVariable)
		{
			auto parentfield = static_cast<FxGlobalVariable *>(classx)->membervar;
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxGlobalVariable *>(classx)->membervar = newfield;
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_StackVariable)
		{
			auto parentfield = static_cast<FxStackVariable *>(classx)->membervar;
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxStackVariable *>(classx)->ReplaceField(newfield);
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_LocalVariable && classx->IsVector())	// vectors are a special case because they are held in registers
		{
			// since this is a vector, all potential things that may get here are single float or an xy-vector.
			auto locvar = static_cast<FxLocalVariable *>(classx);
			locvar->RegOffset = int(membervar->Offset / 8);
			locvar->ValueType = membervar->Type;
			classx = nullptr;
			delete this;
			return locvar;
		}
		else if (classx->ExprType == EFX_LocalVariable && classx->ValueType == TypeColorStruct)
		{
			// This needs special treatment because it'd require accessing the register via address.
			// Fortunately this is the only place where this kind of access is ever needed so an explicit handling is acceptable.
			int bits;
			switch (membervar->SymbolName.GetIndex())
			{
			case NAME_a: bits = 24; break;
			case NAME_r: bits = 16; break;
			case NAME_g: bits = 8; break;
			case NAME_b: default: bits = 0; break;
			}
			classx->ValueType = TypeColor;	// need to set it back.
			FxExpression *x = classx;
			if (bits > 0) x = new FxShift(TK_URShift, x, new FxConstant(bits, ScriptPosition));
			x = new FxBitOp('&', x, new FxConstant(255, ScriptPosition));
			classx = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			if (!(classx->RequestAddress(ctx, &AddressWritable)))
			{
				ScriptPosition.Message(MSG_ERROR, "unable to dereference left side of %s", membervar->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	ValueType = membervar->Type;
	return this;
}